

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O3

int GetQCost(int nVars,int nNegs)

{
  int iVar1;
  int iVar2;
  
  if (nVars < nNegs) {
    __assert_fail("nVars >= nNegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                  ,99,"int GetQCost(int, int)");
  }
  iVar1 = 1;
  switch(nVars) {
  case 0:
    break;
  case 1:
    if (nNegs != 0) {
      if (nNegs == 1) {
        return 2;
      }
      goto switchD_0034b796_default;
    }
    break;
  case 2:
    iVar1 = 5;
    if ((1 < nNegs) && (iVar1 = 6, nNegs != 2)) goto switchD_0034b796_default;
    break;
  case 3:
    iVar1 = 0xe;
    if (1 < nNegs) {
      if (nNegs == 2) {
        return 0x10;
      }
      if (nNegs == 3) {
        return 0x12;
      }
      goto switchD_0034b796_default;
    }
    break;
  default:
switchD_0034b796_default:
    iVar2 = nNegs - nVars / 2;
    iVar1 = 0;
    if (0 < iVar2) {
      iVar1 = iVar2 * 2;
    }
    return iVar1 + nVars * 0xc + -0x1c;
  }
  return iVar1;
}

Assistant:

int GetQCost( int nVars, int nNegs )
{
    int Extra;
    assert( nVars >= nNegs );
    if ( nVars == 0 )  
        return 1;
    if ( nVars == 1 )  
    {
        if ( nNegs == 0 )  return 1;
        if ( nNegs == 1 )  return 2;
    }
    if ( nVars == 2 )
    {
        if ( nNegs <= 1 )  return 5;
        if ( nNegs == 2 )  return 6;
    }
    if ( nVars == 3 )
    {
        if ( nNegs <= 1 )  return 14;
        if ( nNegs == 2 )  return 16;
        if ( nNegs == 3 )  return 18;
    }
    Extra = nNegs - nVars/2;
    return 20 + 12 * (nVars - 4) + (Extra > 0 ? 2 * Extra : 0);

}